

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O1

void Sat_MmStepRestart(Sat_MmStep_t *p)

{
  long lVar1;
  
  if (p->nChunksAlloc != 0) {
    if (0 < p->nChunks) {
      lVar1 = 0;
      do {
        if (p->pChunks[lVar1] != (char *)0x0) {
          free(p->pChunks[lVar1]);
          p->pChunks[lVar1] = (char *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < p->nChunks);
    }
    p->nChunks = 0;
  }
  if (0 < p->nMems) {
    lVar1 = 0;
    do {
      Sat_MmFixedRestart(p->pMems[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nMems);
  }
  return;
}

Assistant:

void Sat_MmStepRestart( Sat_MmStep_t * p )
{
    int i;
    if ( p->nChunksAlloc )
    {
        for ( i = 0; i < p->nChunks; i++ )
            ABC_FREE( p->pChunks[i] );
        p->nChunks = 0;
    }
    for ( i = 0; i < p->nMems; i++ )
        Sat_MmFixedRestart( p->pMems[i] );
}